

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O0

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::getVertexFaceNeighbor
          (NonIterativeFeaturePreservingMeshFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *face_centroid,VertexHandle vh,double r,
          vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *vertex_face_neighbor)

{
  bool bVar1;
  int iVar2;
  Point *pPVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference rVar8;
  reference local_208;
  vector_type local_1f8;
  double local_1e0;
  double length_1;
  Point centroid_1;
  BaseHandle local_1b0;
  int local_1ac;
  FaceHandle temp_fh;
  int i;
  undefined1 local_1a0 [4];
  FaceHandle fh;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  BaseHandle local_16c;
  reference local_168;
  BaseHandle local_154;
  vector_type local_150;
  double local_138;
  double length;
  undefined1 auStack_128 [8];
  Point centroid;
  undefined1 local_108 [8];
  VertexFaceIter vf_it;
  queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
  queue_face_handle;
  allocator<bool> local_8a;
  bool local_89;
  undefined1 local_88 [8];
  vector<bool,_std::allocator<bool>_> mark;
  undefined1 auStack_58 [8];
  Point point;
  double radius;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *vertex_face_neighbor_local;
  double r_local;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *face_centroid_local;
  TriMesh *mesh_local;
  NonIterativeFeaturePreservingMeshFiltering *this_local;
  VertexHandle vh_local;
  
  point.super_VectorDataT<double,_3>.values_[2] = r + r;
  mark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ._4_4_ = vh.super_BaseHandle.idx_;
  pPVar3 = OpenMesh::
           AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
           point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  *)mesh,(VertexHandle)vh.super_BaseHandle.idx_);
  point.super_VectorDataT<double,_3>.values_[1] = (pPVar3->super_VectorDataT<double,_3>).values_[2];
  auStack_58._0_4_ = *(undefined4 *)(pPVar3->super_VectorDataT<double,_3>).values_;
  auStack_58._4_4_ = *(undefined4 *)((long)(pPVar3->super_VectorDataT<double,_3>).values_ + 4);
  point.super_VectorDataT<double,_3>.values_[0]._0_4_ =
       *(undefined4 *)((pPVar3->super_VectorDataT<double,_3>).values_ + 1);
  point.super_VectorDataT<double,_3>.values_[0]._4_4_ =
       *(undefined4 *)((long)(pPVar3->super_VectorDataT<double,_3>).values_ + 0xc);
  sVar4 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))();
  local_89 = false;
  std::allocator<bool>::allocator(&local_8a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_88,sVar4,&local_89,&local_8a);
  std::allocator<bool>::~allocator(&local_8a);
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::clear
            (vertex_face_neighbor);
  std::
  queue<OpenMesh::FaceHandle,std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>>
  ::queue<std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>,void>
            ((queue<OpenMesh::FaceHandle,std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>>
              *)&vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
  centroid.super_VectorDataT<double,_3>.values_[2]._4_4_ = vh.super_BaseHandle.idx_;
  OpenMesh::PolyConnectivity::vf_iter
            ((VertexFaceIter *)local_108,(PolyConnectivity *)mesh,
             (VertexHandle)vh.super_BaseHandle.idx_);
  while( true ) {
    bVar1 = OpenMesh::Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
            ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                        *)local_108);
    if (!bVar1) break;
    length._4_4_ = (int)OpenMesh::Iterators::
                        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                        ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                                     *)local_108);
    iVar2 = OpenMesh::BaseHandle::idx((BaseHandle *)((long)&length + 4));
    pvVar7 = std::
             vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
             operator[](face_centroid,(long)iVar2);
    centroid.super_VectorDataT<double,_3>.values_[1] =
         (pvVar7->super_VectorDataT<double,_3>).values_[2];
    auStack_128 = (undefined1  [8])(pvVar7->super_VectorDataT<double,_3>).values_[0];
    centroid.super_VectorDataT<double,_3>.values_[0] =
         (pvVar7->super_VectorDataT<double,_3>).values_[1];
    OpenMesh::VectorT<double,_3>::operator-
              (&local_150,(VectorT<double,_3> *)auStack_58,(vector_type *)auStack_128);
    local_138 = OpenMesh::VectorT<double,_3>::length(&local_150);
    if (local_138 <= point.super_VectorDataT<double,_3>.values_[2]) {
      local_154.idx_ =
           (int)OpenMesh::Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                             *)local_108);
      std::
      queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
      ::push((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
              *)&vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_,
             (value_type *)&local_154);
    }
    local_16c.idx_ =
         (int)OpenMesh::Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                           *)local_108);
    iVar2 = OpenMesh::BaseHandle::idx(&local_16c);
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_88,(long)iVar2);
    local_168 = rVar8;
    std::_Bit_reference::operator=(&local_168,true);
    OpenMesh::Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                  *)&face_neighbor.
                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                  *)local_108,0);
  }
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
            ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_1a0);
  while( true ) {
    bVar1 = std::
            queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
            ::empty((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                     *)&vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_)
    ;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pvVar5 = std::
             queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
             ::front((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                      *)&vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_
                    );
    i = (pvVar5->super_BaseHandle).idx_;
    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
              (vertex_face_neighbor,(value_type *)&i);
    std::
    queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
    ::pop((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
           *)&vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
    temp_fh.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)i;
    MeshDenoisingBase::getFaceNeighbor
              (&this->super_MeshDenoisingBase,mesh,(FaceHandle)i,kVertexBased,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_1a0);
    local_1ac = 0;
    while( true ) {
      iVar2 = local_1ac;
      sVar4 = std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::size
                        ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                         local_1a0);
      if ((int)sVar4 <= iVar2) break;
      pvVar6 = std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::operator[]
                         ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                          local_1a0,(long)local_1ac);
      local_1b0.idx_ = (pvVar6->super_BaseHandle).idx_;
      iVar2 = OpenMesh::BaseHandle::idx(&local_1b0);
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_88,(long)iVar2);
      centroid_1.super_VectorDataT<double,_3>.values_[2] = (double)rVar8._M_p;
      bVar1 = std::_Bit_reference::operator_cast_to_bool
                        ((_Bit_reference *)(centroid_1.super_VectorDataT<double,_3>.values_ + 2));
      if (!bVar1) {
        iVar2 = OpenMesh::BaseHandle::idx(&local_1b0);
        pvVar7 = std::
                 vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 ::operator[](face_centroid,(long)iVar2);
        centroid_1.super_VectorDataT<double,_3>.values_[1] =
             (pvVar7->super_VectorDataT<double,_3>).values_[2];
        length_1 = (pvVar7->super_VectorDataT<double,_3>).values_[0];
        centroid_1.super_VectorDataT<double,_3>.values_[0] =
             (pvVar7->super_VectorDataT<double,_3>).values_[1];
        OpenMesh::VectorT<double,_3>::operator-
                  (&local_1f8,(VectorT<double,_3> *)auStack_58,(vector_type *)&length_1);
        local_1e0 = OpenMesh::VectorT<double,_3>::length(&local_1f8);
        if (local_1e0 <= point.super_VectorDataT<double,_3>.values_[2]) {
          std::
          queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
          ::push((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                  *)&vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_,
                 (value_type *)&local_1b0);
        }
        iVar2 = OpenMesh::BaseHandle::idx(&local_1b0);
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_88,(long)iVar2);
        local_208 = rVar8;
        std::_Bit_reference::operator=(&local_208,true);
      }
      local_1ac = local_1ac + 1;
    }
  }
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~vector
            ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_1a0);
  std::
  queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
  ::~queue((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
            *)&vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_88)
  ;
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::getVertexFaceNeighbor(TriMesh &mesh, std::vector<TriMesh::Point> &face_centroid, TriMesh::VertexHandle vh, double r,
                                                                       std::vector<TriMesh::FaceHandle> &vertex_face_neighbor)
{
    double radius = 2.0 * r;
    TriMesh::Point point = mesh.point(vh);

    std::vector<bool> mark(mesh.n_faces(), false);
    vertex_face_neighbor.clear();
    std::queue<TriMesh::FaceHandle> queue_face_handle;
    for(TriMesh::VertexFaceIter vf_it = mesh.vf_iter(vh); vf_it.is_valid(); vf_it++)
    {
        TriMesh::Point centroid = face_centroid[(*vf_it).idx()];
        double length = (point - centroid).length();
        if( length <= radius )
            queue_face_handle.push(*vf_it);
        mark[(*vf_it).idx()] = true;
    }

    std::vector<TriMesh::FaceHandle> face_neighbor;

    while(!queue_face_handle.empty())
    {
        TriMesh::FaceHandle fh = queue_face_handle.front();
        vertex_face_neighbor.push_back(fh);
        queue_face_handle.pop();
        getFaceNeighbor(mesh, fh, kVertexBased, face_neighbor);
        for(int i = 0; i < (int)face_neighbor.size(); i++)
        {
            TriMesh::FaceHandle temp_fh = face_neighbor[i];
            if(mark[temp_fh.idx()] == false)
            {
                TriMesh::Point centroid = face_centroid[temp_fh.idx()];
                double length = (point - centroid).length();
                if(length <= radius)
                    queue_face_handle.push(temp_fh);
                mark[temp_fh.idx()] = true;
            }
        }
    }
}